

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Common.h
# Opt level: O2

string * __thiscall
covenant::witness_impl::to_string_abi_cxx11_
          (string *__return_storage_ptr__,witness_impl *this,witness_t *witness,TermFactory *tfac)

{
  type this_00;
  ostream *poVar1;
  uint uVar2;
  stringstream ss;
  string local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  if (*(long *)this == *(long *)(this + 8)) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,"\"\"",(allocator *)local_1b8);
  }
  else {
    std::__cxx11::stringstream::stringstream(local_1b8);
    for (uVar2 = 0; (ulong)uVar2 < (ulong)(*(long *)(this + 8) - *(long *)this >> 2);
        uVar2 = uVar2 + 1) {
      this_00 = boost::shared_ptr<covenant::TerminalFactory>::operator->
                          ((shared_ptr<covenant::TerminalFactory> *)witness);
      TerminalFactory::remap_abi_cxx11_
                (&local_1d8,this_00,(long)*(int *)(*(long *)this + (ulong)uVar2 * 4));
      poVar1 = std::operator<<(local_1a8,(string *)&local_1d8);
      std::operator<<(poVar1," ");
      std::__cxx11::string::~string((string *)&local_1d8);
    }
    std::__cxx11::stringbuf::str();
    std::__cxx11::stringstream::~stringstream(local_1b8);
  }
  return __return_storage_ptr__;
}

Assistant:

inline string to_string(const witness_t& witness, TermFactory tfac)
    {
      if (witness.empty ()) // epsilon
        return "\"\"";

      stringstream ss;      
      for(unsigned int ii = 0; ii < witness.size(); ii++)
      {
        // ss << (char) witness[ii];
        ss << tfac->remap (witness[ii]) << " ";
      }
      return ss.str();
    }